

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

EventLoop * __thiscall EventLoopThread::startLoop(EventLoopThread *this)

{
  void *in_RSI;
  
  if ((this->thread_).started_ != true) {
    Thread::start(&this->thread_);
    pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
    while (this->loop_ == (EventLoop *)0x0) {
      Condition::wait(&this->cond_,in_RSI);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return this->loop_;
  }
  __assert_fail("!thread_.started()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/EventLoopThread.cpp"
                ,0x15,"EventLoop *EventLoopThread::startLoop()");
}

Assistant:

EventLoop* EventLoopThread::startLoop() {
  assert(!thread_.started());
  thread_.start();
  {
    MutexLockGuard lock(mutex_);
    // 一直等到threadFun在Thread里真正跑起来
    while (loop_ == NULL) cond_.wait();
  }
  return loop_;
}